

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monochrome_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_c4c24d::MonochromeTest::MonochromeTest(MonochromeTest *this)

{
  __tuple_element_t<2UL,_tuple<const_CodecFactory_*,_TestMode,_int,_int>_> *p_Var1;
  __tuple_element_t<2UL,_tuple<const_CodecFactory_*,_TestMode,_int,_int>_> *p_Var2;
  undefined8 *in_RDI;
  CodecFactory *in_stack_ffffffffffffffb8;
  EncoderTest *in_stack_ffffffffffffffc0;
  
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,_int,_int>::CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,_int,_int> *)in_stack_ffffffffffffffc0);
  testing::
  WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
  ::GetParam();
  std::get<0ul,libaom_test::CodecFactory_const*,libaom_test::TestMode,int,int>
            ((tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int> *)0x8b70ac);
  libaom_test::EncoderTest::EncoderTest(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  *in_RDI = &PTR__MonochromeTest_01f83130;
  in_RDI[2] = &PTR__MonochromeTest_01f83188;
  in_RDI[3] = &PTR__MonochromeTest_01f831a8;
  p_Var1 = (__tuple_element_t<2UL,_tuple<const_CodecFactory_*,_TestMode,_int,_int>_> *)
           ((long)in_RDI + 0x3f4);
  testing::
  WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
  ::GetParam();
  p_Var2 = std::get<2ul,libaom_test::CodecFactory_const*,libaom_test::TestMode,int,int>
                     ((tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int> *)
                      0x8b7101);
  *p_Var1 = *p_Var2;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x8b711e);
  in_RDI[0x82] = 0;
  return;
}

Assistant:

MonochromeTest()
      : EncoderTest(GET_PARAM(0)), lossless_(GET_PARAM(2)),
        frame0_psnr_y_(0.0) {}